

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void highbd_interpolate_core
               (uint16_t *input,int in_length,uint16_t *output,int out_length,int bd,
               int16_t *interp_filters,int interp_taps)

{
  int iVar1;
  int iVar2;
  uint16_t uVar3;
  uint uVar4;
  uint in_ECX;
  uint16_t *in_RDX;
  int in_ESI;
  int in_stack_00000008;
  int16_t *filter_3;
  int16_t *filter_2;
  int16_t *filter_1;
  int pk;
  int16_t *filter;
  int32_t y;
  int sub_pel;
  int int_pel;
  int k;
  int sum;
  int x2;
  int x1;
  int x;
  uint16_t *optr;
  int32_t offset;
  int32_t delta;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int local_88;
  int local_58;
  int local_4c;
  int local_3c;
  uint16_t *local_38;
  
  uVar4 = (uint)(in_ESI * 0x4000 + (int)in_ECX / 2) / in_ECX;
  if ((int)in_ECX < in_ESI) {
    local_88 = (in_ESI - in_ECX) * 0x2000 + (int)in_ECX / 2;
  }
  else {
    local_88 = -((in_ECX - in_ESI) * 0x2000 + (int)in_ECX / 2);
  }
  local_88 = local_88 / (int)in_ECX;
  local_3c = 0;
  for (local_58 = local_88 + 0x80; iVar1 = local_3c, local_58 >> 0xe < in_stack_00000008 / 2 + -1;
      local_58 = uVar4 + local_58) {
    local_3c = local_3c + 1;
  }
  local_3c = in_ECX - 1;
  for (local_58 = uVar4 * local_3c + local_88 + 0x80; iVar2 = local_3c,
      in_ESI <= (local_58 >> 0xe) + in_stack_00000008 / 2; local_58 = local_58 - uVar4) {
    local_3c = local_3c + -1;
  }
  if (local_3c < iVar1) {
    local_38 = in_RDX;
    for (local_3c = 0; local_3c < (int)in_ECX; local_3c = local_3c + 1) {
      for (local_4c = 0; local_4c < in_stack_00000008; local_4c = local_4c + 1) {
      }
      uVar3 = clip_pixel_highbd(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      *local_38 = uVar3;
      local_38 = local_38 + 1;
    }
  }
  else {
    local_38 = in_RDX;
    for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
      for (local_4c = 0; local_4c < in_stack_00000008; local_4c = local_4c + 1) {
      }
      uVar3 = clip_pixel_highbd(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      *local_38 = uVar3;
      local_38 = local_38 + 1;
    }
    for (; local_3c <= iVar2; local_3c = local_3c + 1) {
      for (local_4c = 0; local_4c < in_stack_00000008; local_4c = local_4c + 1) {
      }
      uVar3 = clip_pixel_highbd(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      *local_38 = uVar3;
      local_38 = local_38 + 1;
    }
    for (; local_3c < (int)in_ECX; local_3c = local_3c + 1) {
      for (local_4c = 0; local_4c < in_stack_00000008; local_4c = local_4c + 1) {
      }
      uVar3 = clip_pixel_highbd(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      *local_38 = uVar3;
      local_38 = local_38 + 1;
    }
  }
  return;
}

Assistant:

static void highbd_interpolate_core(const uint16_t *const input, int in_length,
                                    uint16_t *output, int out_length, int bd,
                                    const int16_t *interp_filters,
                                    int interp_taps) {
  const int32_t delta =
      (((uint32_t)in_length << RS_SCALE_SUBPEL_BITS) + out_length / 2) /
      out_length;
  const int32_t offset =
      in_length > out_length
          ? (((int32_t)(in_length - out_length) << (RS_SCALE_SUBPEL_BITS - 1)) +
             out_length / 2) /
                out_length
          : -(((int32_t)(out_length - in_length)
               << (RS_SCALE_SUBPEL_BITS - 1)) +
              out_length / 2) /
                out_length;
  uint16_t *optr = output;
  int x, x1, x2, sum, k, int_pel, sub_pel;
  int32_t y;

  x = 0;
  y = offset + RS_SCALE_EXTRA_OFF;
  while ((y >> RS_SCALE_SUBPEL_BITS) < (interp_taps / 2 - 1)) {
    x++;
    y += delta;
  }
  x1 = x;
  x = out_length - 1;
  y = delta * x + offset + RS_SCALE_EXTRA_OFF;
  while ((y >> RS_SCALE_SUBPEL_BITS) + (int32_t)(interp_taps / 2) >=
         in_length) {
    x--;
    y -= delta;
  }
  x2 = x;
  if (x1 > x2) {
    for (x = 0, y = offset + RS_SCALE_EXTRA_OFF; x < out_length;
         ++x, y += delta) {
      int_pel = y >> RS_SCALE_SUBPEL_BITS;
      sub_pel = (y >> RS_SCALE_EXTRA_BITS) & RS_SUBPEL_MASK;
      const int16_t *filter = &interp_filters[sub_pel * interp_taps];
      sum = 0;
      for (k = 0; k < interp_taps; ++k) {
        const int pk = int_pel - interp_taps / 2 + 1 + k;
        sum += filter[k] * input[AOMMAX(AOMMIN(pk, in_length - 1), 0)];
      }
      *optr++ = clip_pixel_highbd(ROUND_POWER_OF_TWO(sum, FILTER_BITS), bd);
    }
  } else {
    // Initial part.
    for (x = 0, y = offset + RS_SCALE_EXTRA_OFF; x < x1; ++x, y += delta) {
      int_pel = y >> RS_SCALE_SUBPEL_BITS;
      sub_pel = (y >> RS_SCALE_EXTRA_BITS) & RS_SUBPEL_MASK;
      const int16_t *filter = &interp_filters[sub_pel * interp_taps];
      sum = 0;
      for (k = 0; k < interp_taps; ++k)
        sum += filter[k] * input[AOMMAX(int_pel - interp_taps / 2 + 1 + k, 0)];
      *optr++ = clip_pixel_highbd(ROUND_POWER_OF_TWO(sum, FILTER_BITS), bd);
    }
    // Middle part.
    for (; x <= x2; ++x, y += delta) {
      int_pel = y >> RS_SCALE_SUBPEL_BITS;
      sub_pel = (y >> RS_SCALE_EXTRA_BITS) & RS_SUBPEL_MASK;
      const int16_t *filter = &interp_filters[sub_pel * interp_taps];
      sum = 0;
      for (k = 0; k < interp_taps; ++k)
        sum += filter[k] * input[int_pel - interp_taps / 2 + 1 + k];
      *optr++ = clip_pixel_highbd(ROUND_POWER_OF_TWO(sum, FILTER_BITS), bd);
    }
    // End part.
    for (; x < out_length; ++x, y += delta) {
      int_pel = y >> RS_SCALE_SUBPEL_BITS;
      sub_pel = (y >> RS_SCALE_EXTRA_BITS) & RS_SUBPEL_MASK;
      const int16_t *filter = &interp_filters[sub_pel * interp_taps];
      sum = 0;
      for (k = 0; k < interp_taps; ++k)
        sum += filter[k] *
               input[AOMMIN(int_pel - interp_taps / 2 + 1 + k, in_length - 1)];
      *optr++ = clip_pixel_highbd(ROUND_POWER_OF_TWO(sum, FILTER_BITS), bd);
    }
  }
}